

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

ModuleDefinitionInfo * __thiscall
cmGeneratorTarget::GetModuleDefinitionInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>,_bool>
  pVar4;
  string config_upper;
  ModuleDefinitionInfo info;
  value_type entry;
  key_type local_e0;
  ModuleDefinitionInfo local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
  local_80;
  
  TVar2 = GetType(this);
  if (((TVar2 != SHARED_LIBRARY) && (TVar2 = GetType(this), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return (ModuleDefinitionInfo *)0x0;
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_80.first,config);
    std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>_>_>
          ::find(&(this->ModuleDefinitionInfoMap)._M_t,&local_e0);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    local_c0.DefFile._M_dataplus._M_p = (pointer)&local_c0.DefFile.field_2;
    local_c0.DefFile._M_string_length = 0;
    local_c0.DefFile.field_2._M_local_buf[0] = '\0';
    local_c0.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c0.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0.Sources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ComputeModuleDefinitionInfo(this,config,&local_c0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::ModuleDefinitionInfo_&,_true>
              (&local_80,&local_e0,&local_c0);
    pVar4 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::ModuleDefinitionInfo>>>
                        *)&this->ModuleDefinitionInfoMap,&local_80);
    iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::ModuleDefinitionInfo>
    ::~pair(&local_80);
    ModuleDefinitionInfo::~ModuleDefinitionInfo(&local_c0);
  }
  std::__cxx11::string::~string((string *)&local_e0);
  return (ModuleDefinitionInfo *)(iVar3._M_node + 2);
}

Assistant:

cmGeneratorTarget::ModuleDefinitionInfo const*
cmGeneratorTarget::GetModuleDefinitionInfo(std::string const& config) const
{
  // A module definition file only makes sense on certain target types.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->ModuleDefinitionInfoMap.find(config_upper);
  if (i == this->ModuleDefinitionInfoMap.end()) {
    ModuleDefinitionInfo info;
    this->ComputeModuleDefinitionInfo(config, info);
    ModuleDefinitionInfoMapType::value_type entry(config_upper, info);
    i = this->ModuleDefinitionInfoMap.insert(entry).first;
  }
  return &i->second;
}